

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmenu.cpp
# Opt level: O3

void __thiscall QMenu::~QMenu(QMenu *this)

{
  byte bVar1;
  long lVar2;
  Entry *pEVar3;
  QWidget *widget;
  Data<QHashPrivate::Node<QAction_*,_QWidget_*>_> *d;
  ulong uVar4;
  uint uVar5;
  ulong uVar6;
  
  *(undefined ***)&this->super_QWidget = &PTR_metaObject_007f6f68;
  *(undefined ***)&(this->super_QWidget).super_QPaintDevice = &PTR__QMenu_007f7120;
  lVar2 = *(long *)&(this->super_QWidget).field_0x8;
  d = *(Data<QHashPrivate::Node<QAction_*,_QWidget_*>_> **)(lVar2 + 0x270);
  if ((d != (Data<QHashPrivate::Node<QAction_*,_QWidget_*>_> *)0x0) && (d->size != 0)) {
    if (1 < (uint)(d->ref).atomic._q_value.super___atomic_base<int>._M_i) {
      d = QHashPrivate::Data<QHashPrivate::Node<QAction_*,_QWidget_*>_>::detached(d);
      *(Data<QHashPrivate::Node<QAction_*,_QWidget_*>_> **)(lVar2 + 0x270) = d;
    }
    if (d->spans->offsets[0] == 0xff) {
      uVar4 = 1;
      do {
        uVar6 = uVar4;
        if (d->numBuckets == uVar6) goto LAB_0045f958;
        uVar4 = uVar6 + 1;
        if (d->spans[uVar6 >> 7].offsets[(uint)uVar6 & 0x7f] != 0xff) goto LAB_0045f95b;
      } while( true );
    }
    uVar6 = 0;
LAB_0045f969:
    uVar4 = uVar6 >> 7;
    uVar5 = (uint)uVar6 & 0x7f;
    pEVar3 = d->spans[uVar4].entries;
    bVar1 = d->spans[uVar4].offsets[uVar5];
    widget = *(QWidget **)(pEVar3[bVar1].storage.data + 8);
    if (widget != (QWidget *)0x0) {
      QWidgetAction::releaseWidget(*(QWidgetAction **)pEVar3[bVar1].storage.data,widget);
      pEVar3 = d->spans[uVar4].entries + d->spans[uVar4].offsets[uVar5];
      (pEVar3->storage).data[8] = '\0';
      (pEVar3->storage).data[9] = '\0';
      (pEVar3->storage).data[10] = '\0';
      (pEVar3->storage).data[0xb] = '\0';
      (pEVar3->storage).data[0xc] = '\0';
      (pEVar3->storage).data[0xd] = '\0';
      (pEVar3->storage).data[0xe] = '\0';
      (pEVar3->storage).data[0xf] = '\0';
    }
    do {
      if (d->numBuckets - 1 == uVar6) goto LAB_0045f958;
      uVar6 = uVar6 + 1;
    } while (d->spans[uVar6 >> 7].offsets[(uint)uVar6 & 0x7f] == 0xff);
    goto LAB_0045f95b;
  }
LAB_0045fa09:
  if (*(long *)(lVar2 + 0x2b0) != 0) {
    QEventLoop::exit((int)*(long *)(lVar2 + 0x2b0));
  }
  hideTearOffMenu(this);
  QWidget::~QWidget(&this->super_QWidget);
  return;
LAB_0045f958:
  uVar6 = 0;
  d = (Data<QHashPrivate::Node<QAction_*,_QWidget_*>_> *)0x0;
LAB_0045f95b:
  if ((uVar6 != 0) || (d != (Data<QHashPrivate::Node<QAction_*,_QWidget_*>_> *)0x0))
  goto LAB_0045f969;
  goto LAB_0045fa09;
}

Assistant:

QMenu::~QMenu()
{
    Q_D(QMenu);
    if (!d->widgetItems.isEmpty()) {  // avoid detach on shared null hash
        QHash<QAction *, QWidget *>::iterator it = d->widgetItems.begin();
        for (; it != d->widgetItems.end(); ++it) {
            if (QWidget *widget = it.value()) {
                QWidgetAction *action = static_cast<QWidgetAction *>(it.key());
                action->releaseWidget(widget);
                *it = 0;
            }
        }
    }

    if (d->eventLoop)
        d->eventLoop->exit();
    hideTearOffMenu();
}